

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

bool __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
rec_equal<Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,boost::container::flat_map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>,std::less<int>,void>>>
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,Siblings *s1,
          Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
          *s2)

{
  double dVar1;
  int iVar2;
  int iVar3;
  Siblings *s1_00;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
  *s2_00;
  bool bVar4;
  pointer ppVar5;
  stored_size_type sVar6;
  const_iterator sh1;
  const_iterator sh2;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_38;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_30;
  
  sVar6 = (s1->members_).m_flat_tree.m_data.m_seq.m_holder.m_size;
  if (sVar6 == (s2->members_).m_flat_tree.m_data.m_seq.m_holder.m_size) {
    local_30.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
          *)(s2->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
    ppVar5 = (s1->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
    local_38.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
          *)ppVar5;
    while ((bVar4 = true,
           local_38.m_ptr !=
           (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
            *)(ppVar5 + sVar6) &&
           (local_30.m_ptr !=
            (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
             *)((s2->members_).m_flat_tree.m_data.m_seq.m_holder.m_start +
               (s2->members_).m_flat_tree.m_data.m_seq.m_holder.m_size)))) {
      iVar2 = (local_38.m_ptr)->first;
      if ((iVar2 != (local_30.m_ptr)->first) ||
         ((dVar1 = ((local_38.m_ptr)->second).super_Filtration_simplex_base.filt_,
          dVar1 != ((local_30.m_ptr)->second).super_Filtration_simplex_base.filt_ ||
          (NAN(dVar1) || NAN(((local_30.m_ptr)->second).super_Filtration_simplex_base.filt_)))))
      goto LAB_00115717;
      s1_00 = ((local_38.m_ptr)->second).children_;
      iVar3 = s1_00->parent_;
      s2_00 = ((local_30.m_ptr)->second).children_;
      if ((s2_00->parent_ == iVar2) != (iVar3 == iVar2)) goto LAB_00115717;
      if (iVar3 == iVar2) {
        bVar4 = rec_equal<Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,boost::container::flat_map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>,std::less<int>,void>>>
                          (this,s1_00,s2_00);
        if (!bVar4) goto LAB_00115717;
      }
      boost::container::
      vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
      ::operator++(&local_38);
      boost::container::
      vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
      ::operator++(&local_30);
      ppVar5 = (s1->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
      sVar6 = (s1->members_).m_flat_tree.m_data.m_seq.m_holder.m_size;
    }
  }
  else {
LAB_00115717:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool rec_equal(Siblings const* s1, OtherSiblings const* s2) const {
    if (s1->members().size() != s2->members().size())
      return false;
    auto sh2 = s2->members().begin();
    for (auto sh1 = s1->members().begin();
         (sh1 != s1->members().end() && sh2 != s2->members().end());
         ++sh1, ++sh2) {
      if (sh1->first != sh2->first || !(sh1->second.filtration() == sh2->second.filtration()))
        return false;
      if (has_children(sh1) != has_children(sh2))
        return false;
      // Recursivity on children only if both have children
      else if (has_children(sh1))
        if (!rec_equal(sh1->second.children(), sh2->second.children()))
          return false;
    }
    return true;
  }